

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O1

JL_STATUS JlSetObjectNumberString(JlDataObject *NumberObject,char *NumberString)

{
  bool bVar1;
  int iVar2;
  JL_STATUS JVar3;
  JL_STATUS JVar4;
  _Bool _Var5;
  uint64_t uVar6;
  uint64_t u64;
  char newString [32];
  JlListItem *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  if (NumberString == (char *)0x0 || NumberObject == (JlDataObject *)0x0) {
    return JL_STATUS_INVALID_PARAMETER;
  }
  local_60 = (JlListItem *)0x0;
  if ((*NumberString == '0') && ((byte)(NumberString[1] | 0x20U) == 0x78)) {
    bVar1 = false;
    iVar2 = __isoc99_sscanf(NumberString,"%lx",&local_60);
    JVar3 = JL_STATUS_INVALID_DATA;
    if (iVar2 != 1) goto LAB_001192e8;
    if (NumberObject == (JlDataObject *)0x0) goto LAB_001192df;
    _Var5 = true;
    if (NumberObject->Type == JL_DATA_TYPE_NUMBER) {
LAB_001192c3:
      (NumberObject->field_2).Number.Type = JL_NUM_TYPE_UNSIGNED;
      (NumberObject->field_2).Number.IsHex = _Var5;
      (NumberObject->field_2).List.ListHead = local_60;
      JVar3 = JL_STATUS_SUCCESS;
      bVar1 = true;
      goto LAB_001192e8;
    }
    JVar3 = JL_STATUS_WRONG_TYPE;
  }
  else {
    bVar1 = false;
    iVar2 = __isoc99_sscanf(NumberString,"%lu",&local_60);
    JVar3 = JL_STATUS_INVALID_DATA;
    if (iVar2 != 1) goto LAB_001192e8;
    bVar1 = false;
    sprintf(local_58,"%lu",local_60);
    iVar2 = strcmp(NumberString,local_58);
    if (iVar2 != 0) goto LAB_001192e8;
    if (NumberObject != (JlDataObject *)0x0) {
      JVar3 = JL_STATUS_WRONG_TYPE;
      _Var5 = false;
      bVar1 = false;
      if (NumberObject->Type != JL_DATA_TYPE_NUMBER) goto LAB_001192e8;
      goto LAB_001192c3;
    }
LAB_001192df:
    JVar3 = JL_STATUS_INVALID_PARAMETER;
  }
  bVar1 = false;
LAB_001192e8:
  JVar4 = JL_STATUS_SUCCESS;
  if (!bVar1) {
    local_60 = (JlListItem *)0x0;
    iVar2 = __isoc99_sscanf(NumberString,"%ld");
    JVar4 = JVar3;
    if (iVar2 == 1) {
      sprintf(local_58,"%ld",local_60);
      iVar2 = strcmp(NumberString,local_58);
      if (iVar2 == 0) {
        if (NumberObject == (JlDataObject *)0x0) {
          JVar4 = JL_STATUS_INVALID_PARAMETER;
        }
        else {
          JVar4 = JL_STATUS_WRONG_TYPE;
          if (NumberObject->Type == JL_DATA_TYPE_NUMBER) {
            (NumberObject->field_2).Number.Type = JL_NUM_TYPE_SIGNED;
            (NumberObject->field_2).List.ListHead = local_60;
            JVar4 = JL_STATUS_SUCCESS;
          }
        }
      }
    }
  }
  JVar3 = JL_STATUS_SUCCESS;
  if (JVar4 != JL_STATUS_SUCCESS) {
    local_60 = (JlListItem *)0x0;
    iVar2 = __isoc99_sscanf(NumberString,"%lg");
    JVar3 = JVar4;
    if ((iVar2 == 1) &&
       (((ulong)local_60 & 0x7fffffffffffffff) - 1 < 0xfffffffffffff ||
        (uint)(((ulong)local_60 & 0x7fffffffffffffff) + 0xfff0000000000000 >> 0x35) < 0x3ff)) {
      if (NumberObject == (JlDataObject *)0x0) {
        JVar3 = JL_STATUS_INVALID_PARAMETER;
      }
      else {
        JVar3 = JL_STATUS_WRONG_TYPE;
        if (NumberObject->Type == JL_DATA_TYPE_NUMBER) {
          (NumberObject->field_2).Number.Type = JL_NUM_TYPE_FLOAT;
          (NumberObject->field_2).List.ListHead = local_60;
          JVar3 = JL_STATUS_SUCCESS;
        }
      }
    }
  }
  if (JVar3 != JL_STATUS_SUCCESS) {
    iVar2 = strcasecmp(NumberString,"inf");
    if ((iVar2 == 0) || (iVar2 = strcasecmp(NumberString,"+inf"), iVar2 == 0)) {
      if (NumberObject == (JlDataObject *)0x0) {
        return JL_STATUS_INVALID_PARAMETER;
      }
      if (NumberObject->Type != JL_DATA_TYPE_NUMBER) {
        return JL_STATUS_WRONG_TYPE;
      }
      uVar6 = 0x7ff0000000000000;
    }
    else {
      iVar2 = strcasecmp(NumberString,"-inf");
      if (iVar2 == 0) {
        if (NumberObject == (JlDataObject *)0x0) {
          return JL_STATUS_INVALID_PARAMETER;
        }
        if (NumberObject->Type != JL_DATA_TYPE_NUMBER) {
          return JL_STATUS_WRONG_TYPE;
        }
        uVar6 = 0xfff0000000000000;
      }
      else {
        iVar2 = strcasecmp(NumberString,"nan");
        if (iVar2 != 0) {
          return JVar3;
        }
        if (NumberObject == (JlDataObject *)0x0) {
          return JL_STATUS_INVALID_PARAMETER;
        }
        if (NumberObject->Type != JL_DATA_TYPE_NUMBER) {
          return JL_STATUS_WRONG_TYPE;
        }
        uVar6 = 0x7fffffffffffffff;
      }
    }
    (NumberObject->field_2).Number.Type = JL_NUM_TYPE_FLOAT;
    (NumberObject->field_2).Number.field_1.u64 = uVar6;
  }
  return JL_STATUS_SUCCESS;
}

Assistant:

JL_STATUS
    JlSetObjectNumberString
    (
        JlDataObject*   NumberObject,
        char const*     NumberString
    )
{
    JL_STATUS jlStatus;
    int converted;
    char newString [32] = "";

    if(     NULL != NumberObject
        &&  NULL != NumberString )
    {
        jlStatus = JL_STATUS_INVALID_DATA;

        if( JL_STATUS_SUCCESS != jlStatus )
        {
            // Try to convert the number as u64 first
            uint64_t u64 = 0;
            if( '0' == NumberString[0] && ( 'x' == NumberString[1] || 'X' == NumberString[1] ) )
            {
                // Hex
                converted = sscanf( NumberString, "%"PRIx64"", &u64 );
                if( 1 == converted )
                {
                    // Note: We don't check the exact string match in hex mode because the source
                    // string may be padded eg: 0x0001
                    jlStatus = JlSetObjectNumberHex( NumberObject, u64 );
                }
            }
            else
            {
                // Decimal
                converted = sscanf( NumberString, "%"PRIu64"", &u64 );
                if( 1 == converted )
                {
                    sprintf( newString, "%"PRIu64"", u64 );
                    if( strcmp( NumberString, newString ) == 0 )
                    {
                        jlStatus = JlSetObjectNumberU64( NumberObject, u64 );
                    }
                }
            }
        }

        if( JL_STATUS_SUCCESS != jlStatus )
        {
            // Try to convert the number as a signed 64 bit number
            int64_t s64 = 0;
            converted = sscanf( NumberString, "%"PRId64"", &s64 );
            if( 1 == converted )
            {
                sprintf( newString, "%"PRId64"", s64 );
                if( strcmp( NumberString, newString ) == 0 )
                {
                    jlStatus = JlSetObjectNumberS64( NumberObject, s64 );
                }
            }

        }

        if( JL_STATUS_SUCCESS != jlStatus )
        {
            // Try to convert the number as a float
            double f64 = 0.0;
            converted = sscanf( NumberString, "%lg", &f64 );
            if( 1 == converted )
            {
                double a_inf = DBL_MAX * 2.0;
                double a_ninf = DBL_MAX * -2.0;

                if(     0.0 != f64
                    &&  !isnan( f64 )
                    &&  a_inf != f64
                    &&  a_ninf != f64 )
                {
                    jlStatus = JlSetObjectNumberF64( NumberObject, f64 );
                }
            }
        }

        if( JL_STATUS_SUCCESS != jlStatus )
        {
            // Try to convert as inf, +inf, -inf, or nan
            if( strcasecmp( NumberString, "inf" ) == 0 || strcasecmp( NumberString, "+inf" ) == 0 )
            {
                double a_inf = DBL_MAX * 2.0;
                jlStatus = JlSetObjectNumberF64( NumberObject, a_inf );
            }
            else if( strcasecmp( NumberString, "-inf" ) == 0 )
            {
                double a_ninf = DBL_MAX * -2.0;
                jlStatus = JlSetObjectNumberF64( NumberObject, a_ninf );
            }
            else if( strcasecmp( NumberString, "nan" ) == 0 )
            {
                union
                {
                    uint64_t    bits;
                    double      f64;
                } a_nan = { 0x7fffffffffffffffULL };      // Set all bits except sign to make a NaN

                jlStatus = JlSetObjectNumberF64( NumberObject, a_nan.f64 );
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}